

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cxx
# Opt level: O0

void __thiscall Matrix::~Matrix(Matrix *this)

{
  Physical *pPVar1;
  long lVar2;
  Physical *this_00;
  Matrix *this_local;
  
  (this->super_Physical)._vptr_Physical = (_func_int **)&PTR__Matrix_0018f6e8;
  if (this->pSize != (int *)0x0) {
    operator_delete__(this->pSize);
  }
  if (this->pMult != (int *)0x0) {
    operator_delete__(this->pMult);
  }
  pPVar1 = this->pPhysicals;
  if (pPVar1 != (Physical *)0x0) {
    lVar2 = *(long *)&pPVar1[-1].physicalUnit.nExpPrefix;
    this_00 = pPVar1 + lVar2;
    while (pPVar1 != this_00) {
      this_00 = this_00 + -1;
      Physical::~Physical(this_00);
    }
    operator_delete__(&pPVar1[-1].physicalUnit.nExpPrefix,lVar2 * 0x98 + 8);
  }
  std::__cxx11::string::~string((string *)&this->sMatrixName);
  boost::shared_array<double>::~shared_array(&this->matrixParent);
  Physical::~Physical(&this->super_Physical);
  return;
}

Assistant:

Matrix::~Matrix()
{
	delete[] pSize;
	delete[] pMult;
	delete[] pPhysicals;
}